

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QStringList * __thiscall
QStyleSheetStyleSelector::nodeIds(QStyleSheetStyleSelector *this,NodePtr node)

{
  long lVar1;
  ulong uVar2;
  long *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringList *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = (**(code **)(*in_RSI + 0x38))();
  if ((uVar2 & 1) == 0) {
    QObject::objectName();
    QList<QString>::QList<QString,void>(this_00,(QString *)in_RDI);
    QString::~QString((QString *)0x455d66);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<QString>::QList((QList<QString> *)0x455d2f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QStringList nodeIds(NodePtr node) const override
    { return isNullNode(node) ? QStringList() : QStringList(OBJECT_PTR(node)->objectName()); }